

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void renameParentFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  sqlite3 *db;
  bool bVar1;
  int iVar2;
  int iVar3;
  uchar *z;
  char *pcVar4;
  void *pvVar5;
  char *pcVar6;
  char *pcVar7;
  size_t __n;
  uchar *puVar8;
  int token;
  int local_5c;
  char *local_58;
  uchar *local_50;
  void *local_48;
  sqlite3_context *local_40;
  char *local_38;
  
  db = context->pOut->db;
  z = (uchar *)sqlite3ValueText(*argv,'\x01');
  pcVar4 = (char *)sqlite3ValueText(argv[1],'\x01');
  pvVar5 = sqlite3ValueText(argv[2],'\x01');
  if (pcVar4 != (char *)0x0 && z != (uchar *)0x0) {
    local_50 = z;
    local_40 = context;
    local_38 = pcVar4;
    if (*z == '\0') {
      local_58 = (char *)0x0;
    }
    else {
      local_58 = (char *)0x0;
      local_48 = pvVar5;
      do {
        iVar2 = sqlite3GetToken(z,&local_5c);
        if (local_5c == 0x69) {
          do {
            puVar8 = z;
            z = puVar8 + iVar2;
            iVar2 = sqlite3GetToken(z,&local_5c);
          } while (local_5c == 0xa3);
          if (local_5c == 0xa4) {
LAB_0025953b:
            bVar1 = false;
          }
          else {
            __n = (size_t)iVar2;
            if (puVar8 == (uchar *)0x0) {
              pcVar4 = (char *)0x0;
            }
            else {
              pcVar4 = (char *)sqlite3DbMallocRawNN(db,__n + 1);
              if (pcVar4 != (char *)0x0) {
                memcpy(pcVar4,z,__n);
                pcVar4[__n] = '\0';
              }
            }
            if (pcVar4 == (char *)0x0) goto LAB_0025953b;
            sqlite3Dequote(pcVar4);
            iVar3 = sqlite3StrICmp(local_38,pcVar4);
            pcVar6 = local_58;
            if (iVar3 == 0) {
              pcVar7 = local_58;
              if (local_58 == (char *)0x0) {
                pcVar7 = "";
              }
              pcVar7 = sqlite3MPrintf(db,"%s%.*s\"%w\"",pcVar7,(ulong)(uint)((int)z - (int)local_50)
                                      ,local_50,local_48);
              if (pcVar6 != (char *)0x0) {
                sqlite3DbFreeNN(db,pcVar6);
              }
              local_50 = z + __n;
              local_58 = pcVar7;
            }
            sqlite3DbFreeNN(db,pcVar4);
            bVar1 = true;
          }
          if (!bVar1) break;
        }
        puVar8 = z + iVar2;
        z = z + iVar2;
      } while (*puVar8 != '\0');
    }
    pcVar4 = local_58;
    pcVar6 = "";
    if (local_58 != (char *)0x0) {
      pcVar6 = local_58;
    }
    pcVar6 = sqlite3MPrintf(db,"%s%s",pcVar6,local_50);
    setResultStrOrError(local_40,pcVar6,-1,'\x01',sqlite3MallocSize);
    if (pcVar4 != (char *)0x0) {
      sqlite3DbFreeNN(db,pcVar4);
      return;
    }
  }
  return;
}

Assistant:

static void renameParentFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  char *zOutput = 0;
  char *zResult;
  unsigned char const *zInput = sqlite3_value_text(argv[0]);
  unsigned char const *zOld = sqlite3_value_text(argv[1]);
  unsigned char const *zNew = sqlite3_value_text(argv[2]);

  unsigned const char *z;         /* Pointer to token */
  int n;                          /* Length of token z */
  int token;                      /* Type of token */

  UNUSED_PARAMETER(NotUsed);
  if( zInput==0 || zOld==0 ) return;
  for(z=zInput; *z; z=z+n){
    n = sqlite3GetToken(z, &token);
    if( token==TK_REFERENCES ){
      char *zParent;
      do {
        z += n;
        n = sqlite3GetToken(z, &token);
      }while( token==TK_SPACE );

      if( token==TK_ILLEGAL ) break;
      zParent = sqlite3DbStrNDup(db, (const char *)z, n);
      if( zParent==0 ) break;
      sqlite3Dequote(zParent);
      if( 0==sqlite3StrICmp((const char *)zOld, zParent) ){
        char *zOut = sqlite3MPrintf(db, "%s%.*s\"%w\"", 
            (zOutput?zOutput:""), (int)(z-zInput), zInput, (const char *)zNew
        );
        sqlite3DbFree(db, zOutput);
        zOutput = zOut;
        zInput = &z[n];
      }
      sqlite3DbFree(db, zParent);
    }
  }

  zResult = sqlite3MPrintf(db, "%s%s", (zOutput?zOutput:""), zInput), 
  sqlite3_result_text(context, zResult, -1, SQLITE_DYNAMIC);
  sqlite3DbFree(db, zOutput);
}